

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

XMLCh __thiscall xercesc_4_0::ReaderMgr::peekNextChar(ReaderMgr *this)

{
  bool bVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  ulong uVar4;
  XMLReader *this_00;
  
  this_00 = this->fCurReader;
  uVar4 = this_00->fCharIndex;
  if (this_00->fCharsAvail <= uVar4) {
    bVar1 = XMLReader::refreshCharBuffer(this_00);
    if (!bVar1) {
      bVar1 = popReader(this);
      if (!bVar1) {
        return L'\0';
      }
      this_00 = this->fCurReader;
      uVar4 = this_00->fCharIndex;
      if (this_00->fCharsAvail <= uVar4) {
        bVar1 = XMLReader::refreshCharBuffer(this_00);
        if (!bVar1) {
          return L'\0';
        }
        uVar4 = this_00->fCharIndex;
      }
      XVar2 = this_00->fCharBuf[uVar4];
      if (XVar2 != L'\r') {
        if (this_00->fNEL != true) {
          return XVar2;
        }
        if ((XVar2 != L'\x2028') && (XVar2 != L'\x85')) {
          return XVar2;
        }
      }
      goto LAB_002aa8ca;
    }
    uVar4 = this_00->fCharIndex;
  }
  XVar2 = this_00->fCharBuf[uVar4];
  if (XVar2 != L'\r') {
    if (this_00->fNEL != true) {
      return XVar2;
    }
    if ((XVar2 != L'\x85') && (XVar2 != L'\x2028')) {
      return XVar2;
    }
  }
LAB_002aa8ca:
  XVar3 = L'\n';
  if (this_00->fSource != Source_External) {
    XVar3 = XVar2;
  }
  return XVar3;
}

Assistant:

XMLCh ReaderMgr::peekNextChar()
{
    XMLCh chRet;
    if (fCurReader->peekNextChar(chRet))
        return chRet;

    //
    //  Didn't get anything back so this reader is hosed. So lets move to
    //  the next reader on the stack. If this fails, it will be because
    //  its the end of the original file, and we just return zero.
    //
    if (!popReader())
        return XMLCh(0);

    // Else peek again and return the character
    fCurReader->peekNextChar(chRet);
    return chRet;
}